

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestMemoryAllocatorTest.cpp
# Opt level: O1

void __thiscall
TEST_TestMemoryAccountant_reportWithCacheSizes_Test::testBody
          (TEST_TestMemoryAccountant_reportWithCacheSizes_Test *this)

{
  MemoryAccountant *this_00;
  UtestShell *pUVar1;
  char *pcVar2;
  TestTerminator *pTVar3;
  size_t cacheSizes [1];
  MemoryAccountant local_30;
  
  local_30.useCacheSizes_ = true;
  local_30._17_7_ = 0;
  this_00 = &(this->super_TEST_GROUP_CppUTestGroupTestMemoryAccountant).accountant;
  MemoryAccountant::useCacheSizes(this_00,(size_t *)&local_30.useCacheSizes_,1);
  MemoryAccountant::dealloc(this_00,8);
  MemoryAccountant::dealloc(this_00,0xc);
  MemoryAccountant::dealloc(this_00,0x14);
  MemoryAccountant::alloc(this_00,4);
  MemoryAccountant::dealloc(this_00,4);
  MemoryAccountant::alloc(this_00,4);
  pUVar1 = UtestShell::getCurrent();
  MemoryAccountant::report(&local_30);
  pcVar2 = SimpleString::asCharString((SimpleString *)&local_30);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar1->_vptr_UtestShell[9])
            (pUVar1,
             "CppUTest Memory Accountant report (with cache sizes):\nCache size          # allocations    # deallocations   max # allocations at one time\n    4                   2                1                 1\nother                   0                3                 0\n   Thank you for your business\n"
             ,pcVar2,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestMemoryAllocatorTest.cpp"
             ,0x205,pTVar3);
  SimpleString::~SimpleString((SimpleString *)&local_30);
  return;
}

Assistant:

TEST(TestMemoryAccountant, reportWithCacheSizes)
{
    size_t cacheSizes[] = {4};

    accountant.useCacheSizes(cacheSizes, 1);
    accountant.dealloc(8);
    accountant.dealloc(12);
    accountant.dealloc(20);

    accountant.alloc(4);
    accountant.dealloc(4);
    accountant.alloc(4);
    STRCMP_EQUAL("CppUTest Memory Accountant report (with cache sizes):\n"
                 "Cache size          # allocations    # deallocations   max # allocations at one time\n"
                 "    4                   2                1                 1\n"
                 "other                   0                3                 0\n"
                 "   Thank you for your business\n"
                 , accountant.report().asCharString());
}